

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaAddSchemaDoc
              (xmlSchemaParserCtxtPtr pctxt,int type,xmlChar *schemaLocation,xmlDocPtr schemaDoc,
              char *schemaBuffer,int schemaBufferLen,xmlNodePtr invokingNode,
              xmlChar *sourceTargetNamespace,xmlChar *importNamespace,
              xmlSchemaBucketPtr_conflict *bucket)

{
  bool bVar1;
  int iVar2;
  _xmlNode *p_Var3;
  xmlParserCtxtPtr ctxt;
  xmlChar *pxVar4;
  xmlError *pxVar5;
  xmlNodePtr root;
  xmlNodePtr docElem;
  xmlError *lerr;
  xmlParserCtxtPtr parserCtxt;
  xmlSchemaBucketPtr_conflict chamel;
  xmlSchemaBucketPtr_conflict bkt;
  int preserveDoc;
  int located;
  int err;
  int res;
  xmlDocPtr doc;
  xmlSchemaSchemaRelationPtr_conflict relation;
  xmlChar *targetNamespace;
  int schemaBufferLen_local;
  char *schemaBuffer_local;
  xmlDocPtr schemaDoc_local;
  xmlChar *schemaLocation_local;
  int type_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  relation = (xmlSchemaSchemaRelationPtr_conflict)0x0;
  doc = (xmlDocPtr)0x0;
  _err = (xmlDocPtr)0x0;
  preserveDoc = 0;
  bkt._4_4_ = 0;
  bVar1 = false;
  chamel = (xmlSchemaBucketPtr_conflict)0x0;
  if (bucket != (xmlSchemaBucketPtr_conflict *)0x0) {
    *bucket = (xmlSchemaBucketPtr_conflict)0x0;
  }
  if ((uint)type < 2) {
    preserveDoc = 0xc0a;
  }
  else if (type == 2) {
    preserveDoc = 0xbea;
  }
  else if (type == 3) {
    preserveDoc = 0xc09;
  }
  schemaDoc_local = (xmlDocPtr)schemaLocation;
  if (((type == 0) || (pctxt->constructor->buckets == (xmlSchemaItemListPtr)0x0)) ||
     (pctxt->constructor->buckets->nbItems < 1)) {
LAB_001d3beb:
    if (schemaDoc == (xmlDocPtr)0x0) {
      if ((schemaDoc_local == (xmlDocPtr)0x0) && (schemaBuffer == (char *)0x0)) {
        xmlSchemaPErr(pctxt,(xmlNodePtr)0x0,0x6de,
                      "No information for parsing was provided with the given schema parser context.\n"
                      ,(xmlChar *)0x0,(xmlChar *)0x0);
      }
      else {
        ctxt = xmlNewParserCtxt();
        if (ctxt != (xmlParserCtxtPtr)0x0) {
          if (pctxt->serror != (xmlStructuredErrorFunc)0x0) {
            xmlCtxtSetErrorHandler(ctxt,pctxt->serror,pctxt->errCtxt);
          }
          if (pctxt->resourceLoader != (xmlResourceLoader)0x0) {
            xmlCtxtSetResourceLoader(ctxt,pctxt->resourceLoader,pctxt->resourceCtxt);
          }
          if ((pctxt->dict != (xmlDictPtr)0x0) && (ctxt->dict != (xmlDictPtr)0x0)) {
            xmlDictFree(ctxt->dict);
            ctxt->dict = pctxt->dict;
            xmlDictReference(ctxt->dict);
          }
          if (schemaDoc_local == (xmlDocPtr)0x0) {
            if (schemaBuffer != (char *)0x0) {
              _err = xmlCtxtReadMemory(ctxt,schemaBuffer,schemaBufferLen,(char *)0x0,(char *)0x0,2);
              schemaDoc_local = (xmlDocPtr)anon_var_dwarf_50faa;
              if (_err != (xmlDocPtr)0x0) {
                pxVar4 = xmlStrdup((xmlChar *)"in_memory_buffer");
                _err->URL = pxVar4;
              }
            }
          }
          else {
            _err = xmlCtxtReadFile(ctxt,(char *)schemaDoc_local,(char *)0x0,2);
          }
          if ((_err == (xmlDocPtr)0x0) &&
             ((pxVar5 = xmlGetLastError(), pxVar5 == (xmlError *)0x0 || (pxVar5->domain != 8)))) {
            bkt._4_4_ = 1;
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_IMPORT_2_1,
                               invokingNode,(xmlSchemaBasicItemPtr)0x0,
                               "Failed to parse the XML resource \'%s\'",(xmlChar *)schemaDoc_local,
                               (xmlChar *)0x0);
          }
          xmlFreeParserCtxt(ctxt);
          if ((_err == (xmlDocPtr)0x0) && (bkt._4_4_ != 0)) goto LAB_001d4017;
          goto LAB_001d3e2c;
        }
        xmlSchemaPErrMemory((xmlSchemaParserCtxtPtr)0x0);
      }
    }
    else {
      bVar1 = true;
      _err = schemaDoc;
      if (schemaDoc->URL == (xmlChar *)0x0) {
        schemaDoc_local = (xmlDocPtr)anon_var_dwarf_50faa;
      }
      else {
        schemaDoc_local = (xmlDocPtr)xmlDictLookup(pctxt->dict,schemaDoc->URL,-1);
      }
LAB_001d3e2c:
      if (_err != (xmlDoc *)0x0) {
        bkt._4_4_ = 1;
        root = xmlDocGetRootElement(_err);
        if (root == (xmlNodePtr)0x0) {
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_NOROOT,invokingNode,
                             (xmlSchemaBasicItemPtr)0x0,
                             "The document \'%s\' has no document element",
                             (xmlChar *)schemaDoc_local,(xmlChar *)0x0);
LAB_001d4017:
          if (((_err != (xmlDocPtr)0x0) && (!bVar1)) &&
             (xmlFreeDoc(_err), chamel != (xmlSchemaBucketPtr_conflict)0x0)) {
            chamel->doc = (xmlDocPtr)0x0;
          }
          return pctxt->err;
        }
        xmlSchemaCleanupDoc(pctxt,root);
        if ((((root == (xmlNodePtr)0x0) || (root->ns == (xmlNs *)0x0)) ||
            (iVar2 = xmlStrEqual(root->name,"schema"), iVar2 == 0)) ||
           (iVar2 = xmlStrEqual(root->ns->href,xmlSchemaNs), iVar2 == 0)) {
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_NOT_SCHEMA,invokingNode,
                             (xmlSchemaBasicItemPtr)0x0,
                             "The XML document \'%s\' is not a schema document",
                             (xmlChar *)schemaDoc_local,(xmlChar *)0x0);
          goto LAB_001d4017;
        }
        relation = (xmlSchemaSchemaRelationPtr_conflict)
                   xmlSchemaGetProp(pctxt,root,"targetNamespace");
      }
      if (((chamel != (xmlSchemaBucketPtr_conflict)0x0) || (bkt._4_4_ == 0)) ||
         (chamel = xmlSchemaBucketCreate(pctxt,type,(xmlChar *)relation),
         chamel != (xmlSchemaBucketPtr_conflict)0x0)) {
        if (chamel != (xmlSchemaBucketPtr_conflict)0x0) {
          chamel->schemaLocation = (xmlChar *)schemaDoc_local;
          chamel->located = bkt._4_4_;
          if (_err != (xmlDoc *)0x0) {
            chamel->doc = _err;
            chamel->targetNamespace = (xmlChar *)relation;
            chamel->origTargetNamespace = (xmlChar *)relation;
            if (bVar1) {
              chamel->preserveDoc = 1;
            }
          }
          if ((type == 0) || (type == 1)) {
            chamel->imported = chamel->imported + 1;
          }
          if (doc != (xmlDocPtr)0x0) {
            doc->children = (_xmlNode *)chamel;
          }
        }
        goto LAB_001d3ffc;
      }
      chamel = (xmlSchemaBucketPtr_conflict)0x0;
    }
LAB_001d404e:
    if (((_err != (xmlDocPtr)0x0) && (!bVar1)) &&
       (xmlFreeDoc(_err), chamel != (xmlSchemaBucketPtr_conflict)0x0)) {
      chamel->doc = (xmlDocPtr)0x0;
    }
    pctxt_local._4_4_ = -1;
  }
  else {
    if (((schemaLocation == (xmlChar *)0x0) ||
        (chamel = xmlSchemaGetSchemaBucket(pctxt,schemaLocation),
        chamel == (xmlSchemaBucketPtr_conflict)0x0)) || (pctxt->constructor->bucket != chamel)) {
      doc = (xmlDocPtr)xmlSchemaSchemaRelationCreate();
      if (doc == (xmlDocPtr)0x0) {
        return -1;
      }
      xmlSchemaSchemaRelationAddChild
                (pctxt->constructor->bucket,(xmlSchemaSchemaRelationPtr_conflict)doc);
      doc->type = type;
      if ((type == 0) || (type == 1)) {
        doc->name = (char *)importNamespace;
        if (schemaLocation == (xmlChar *)0x0) goto LAB_001d3ffc;
        relation = (xmlSchemaSchemaRelationPtr_conflict)importNamespace;
      }
      if (chamel != (xmlSchemaBucketPtr_conflict)0x0) {
        if (((type == 0) || (type == 1)) && (chamel->imported == 0)) {
          if (schemaLocation == (xmlChar *)0x0) {
            schemaDoc_local = (xmlDocPtr)anon_var_dwarf_50faa;
          }
          iVar2 = xmlStrEqual((xmlChar *)schemaDoc_local,chamel->schemaLocation);
          if (iVar2 == 0) {
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,preserveDoc,invokingNode,
                               (xmlSchemaBasicItemPtr)0x0,
                               "The schema document \'%s\' cannot be imported, since it was already included or redefined"
                               ,(xmlChar *)schemaDoc_local,(xmlChar *)0x0);
            goto LAB_001d3ffc;
          }
        }
        else if (((type != 0) && (type != 1)) && (chamel->imported != 0)) {
          if (schemaLocation == (xmlChar *)0x0) {
            schemaDoc_local = (xmlDocPtr)anon_var_dwarf_50faa;
          }
          iVar2 = xmlStrEqual((xmlChar *)schemaDoc_local,chamel->schemaLocation);
          if (iVar2 == 0) {
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,preserveDoc,invokingNode,
                               (xmlSchemaBasicItemPtr)0x0,
                               "The schema document \'%s\' cannot be included or redefined, since it was already imported"
                               ,(xmlChar *)schemaDoc_local,(xmlChar *)0x0);
            goto LAB_001d3ffc;
          }
        }
      }
      if ((type == 0) || (type == 1)) {
        if (chamel == (xmlSchemaBucketPtr_conflict)0x0) {
          chamel = xmlSchemaGetSchemaBucketByTNS(pctxt,importNamespace,1);
          if ((_xmlNode *)chamel != (_xmlNode *)0x0) {
            doc->children = (_xmlNode *)chamel;
            if (*(xmlChar **)&((_xmlNode *)chamel)->type != (xmlChar *)0x0) {
              iVar2 = xmlStrEqual((xmlChar *)schemaDoc_local,
                                  *(xmlChar **)&((_xmlNode *)chamel)->type);
              if (iVar2 == 0) {
                if (schemaDoc_local == (xmlDocPtr)0x0) {
                  schemaDoc_local = (xmlDocPtr)anon_var_dwarf_50faa;
                }
                xmlSchemaCustomWarning
                          ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_SKIP_SCHEMA,invokingNode
                           ,(xmlSchemaTypePtr)0x0,
                           "Skipping import of schema located at \'%s\' for the namespace \'%s\', since this namespace was already imported with the schema located at \'%s\'"
                           ,(xmlChar *)schemaDoc_local,importNamespace,
                           *(xmlChar **)&((_xmlNode *)chamel)->type);
              }
              goto LAB_001d3ffc;
            }
            *(xmlDocPtr *)&((_xmlNode *)chamel)->type = schemaDoc_local;
          }
LAB_001d3bbb:
          if ((chamel == (xmlSchemaBucketPtr_conflict)0x0) || (chamel->doc == (xmlDocPtr)0x0))
          goto LAB_001d3beb;
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaAddSchemaDoc",
                     "trying to load a schema doc, but a doc is already assigned to the schema bucket"
                    );
          goto LAB_001d404e;
        }
        doc->children = (_xmlNode *)chamel;
      }
      else {
        if (chamel == (xmlSchemaBucketPtr_conflict)0x0) goto LAB_001d3bbb;
        if ((chamel->origTargetNamespace == (xmlChar *)0x0) &&
           (chamel->targetNamespace != sourceTargetNamespace)) {
          p_Var3 = (_xmlNode *)
                   xmlSchemaGetChameleonSchemaBucket
                             (pctxt,(xmlChar *)schemaDoc_local,sourceTargetNamespace);
          if (p_Var3 == (_xmlNode *)0x0) {
            chamel = (xmlSchemaBucketPtr_conflict)0x0;
            goto LAB_001d3bbb;
          }
          doc->children = p_Var3;
        }
        else {
          doc->children = (_xmlNode *)chamel;
        }
      }
    }
    else {
      xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,preserveDoc,invokingNode,
                         (xmlSchemaBasicItemPtr)0x0,
                         "The schema must not import/include/redefine itself",(xmlChar *)0x0,
                         (xmlChar *)0x0);
    }
LAB_001d3ffc:
    if (bucket != (xmlSchemaBucketPtr_conflict *)0x0) {
      *bucket = chamel;
    }
    pctxt_local._4_4_ = 0;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaAddSchemaDoc(xmlSchemaParserCtxtPtr pctxt,
		int type, /* import or include or redefine */
		const xmlChar *schemaLocation,
		xmlDocPtr schemaDoc,
		const char *schemaBuffer,
		int schemaBufferLen,
		xmlNodePtr invokingNode,
		const xmlChar *sourceTargetNamespace,
		const xmlChar *importNamespace,
		xmlSchemaBucketPtr *bucket)
{
    const xmlChar *targetNamespace = NULL;
    xmlSchemaSchemaRelationPtr relation = NULL;
    xmlDocPtr doc = NULL;
    int res = 0, err = 0, located = 0, preserveDoc = 0;
    xmlSchemaBucketPtr bkt = NULL;

    if (bucket != NULL)
	*bucket = NULL;

    switch (type) {
	case XML_SCHEMA_SCHEMA_IMPORT:
	case XML_SCHEMA_SCHEMA_MAIN:
	    err = XML_SCHEMAP_SRC_IMPORT;
	    break;
	case XML_SCHEMA_SCHEMA_INCLUDE:
	    err = XML_SCHEMAP_SRC_INCLUDE;
	    break;
	case XML_SCHEMA_SCHEMA_REDEFINE:
	    err = XML_SCHEMAP_SRC_REDEFINE;
	    break;
    }


    /* Special handling for the main schema:
    * skip the location and relation logic and just parse the doc.
    * We need just a bucket to be returned in this case.
    */
    if ((type == XML_SCHEMA_SCHEMA_MAIN) || (! WXS_HAS_BUCKETS(pctxt)))
	goto doc_load;

    /* Note that we expect the location to be an absolute URI. */
    if (schemaLocation != NULL) {
	bkt = xmlSchemaGetSchemaBucket(pctxt, schemaLocation);
	if ((bkt != NULL) &&
	    (pctxt->constructor->bucket == bkt)) {
	    /* Report self-imports/inclusions/redefinitions. */

	    xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		invokingNode, NULL,
		"The schema must not import/include/redefine itself",
		NULL, NULL);
	    goto exit;
	}
    }
    /*
    * Create a relation for the graph of schemas.
    */
    relation = xmlSchemaSchemaRelationCreate();
    if (relation == NULL)
	return(-1);
    xmlSchemaSchemaRelationAddChild(pctxt->constructor->bucket,
	relation);
    relation->type = type;

    /*
    * Save the namespace import information.
    */
    if (WXS_IS_BUCKET_IMPMAIN(type)) {
	relation->importNamespace = importNamespace;
	if (schemaLocation == NULL) {
	    /*
	    * No location; this is just an import of the namespace.
	    * Note that we don't assign a bucket to the relation
	    * in this case.
	    */
	    goto exit;
	}
	targetNamespace = importNamespace;
    }

    /* Did we already fetch the doc? */
    if (bkt != NULL) {
	if ((WXS_IS_BUCKET_IMPMAIN(type)) && (! bkt->imported)) {
	    /*
	    * We included/redefined and then try to import a schema,
	    * but the new location provided for import was different.
	    */
	    if (schemaLocation == NULL)
		schemaLocation = BAD_CAST "in_memory_buffer";
	    if (!xmlStrEqual(schemaLocation,
		bkt->schemaLocation)) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		    invokingNode, NULL,
		    "The schema document '%s' cannot be imported, since "
		    "it was already included or redefined",
		    schemaLocation, NULL);
		goto exit;
	    }
	} else if ((! WXS_IS_BUCKET_IMPMAIN(type)) && (bkt->imported)) {
	    /*
	    * We imported and then try to include/redefine a schema,
	    * but the new location provided for the include/redefine
	    * was different.
	    */
	    if (schemaLocation == NULL)
		schemaLocation = BAD_CAST "in_memory_buffer";
	    if (!xmlStrEqual(schemaLocation,
		bkt->schemaLocation)) {
		xmlSchemaCustomErr(ACTXT_CAST pctxt, err,
		    invokingNode, NULL,
		    "The schema document '%s' cannot be included or "
		    "redefined, since it was already imported",
		    schemaLocation, NULL);
		goto exit;
	    }
	}
    }

    if (WXS_IS_BUCKET_IMPMAIN(type)) {
	/*
	* Given that the schemaLocation [attribute] is only a hint, it is open
	* to applications to ignore all but the first <import> for a given
	* namespace, regardless of the `actual value` of schemaLocation, but
	* such a strategy risks missing useful information when new
	* schemaLocations are offered.
	*
	* We will use the first <import> that comes with a location.
	* Further <import>s *with* a location, will result in an error.
	* TODO: Better would be to just report a warning here, but
	* we'll try it this way until someone complains.
	*
	* Schema Document Location Strategy:
	* 3 Based on the namespace name, identify an existing schema document,
	* either as a resource which is an XML document or a <schema> element
	* information item, in some local schema repository;
	* 5 Attempt to resolve the namespace name to locate such a resource.
	*
	* NOTE: (3) and (5) are not supported.
	*/
	if (bkt != NULL) {
	    relation->bucket = bkt;
	    goto exit;
	}
	bkt = xmlSchemaGetSchemaBucketByTNS(pctxt,
	    importNamespace, 1);

	if (bkt != NULL) {
	    relation->bucket = bkt;
	    if (bkt->schemaLocation == NULL) {
		/* First given location of the schema; load the doc. */
		bkt->schemaLocation = schemaLocation;
	    } else {
		if (!xmlStrEqual(schemaLocation,
		    bkt->schemaLocation)) {
		    /*
		    * Additional location given; just skip it.
		    * URGENT TODO: We should report a warning here.
		    * res = XML_SCHEMAP_SRC_IMPORT;
		    */
		    if (schemaLocation == NULL)
			schemaLocation = BAD_CAST "in_memory_buffer";

		    xmlSchemaCustomWarning(ACTXT_CAST pctxt,
			XML_SCHEMAP_WARN_SKIP_SCHEMA,
			invokingNode, NULL,
			"Skipping import of schema located at '%s' for the "
			"namespace '%s', since this namespace was already "
			"imported with the schema located at '%s'",
			schemaLocation, importNamespace, bkt->schemaLocation);
		}
		goto exit;
	    }
	}
	/*
	* No bucket + first location: load the doc and create a
	* bucket.
	*/
    } else {
	/* <include> and <redefine> */
	if (bkt != NULL) {

	    if ((bkt->origTargetNamespace == NULL) &&
		(bkt->targetNamespace != sourceTargetNamespace)) {
		xmlSchemaBucketPtr chamel;

		/*
		* Chameleon include/redefine: skip loading only if it was
		* already build for the targetNamespace of the including
		* schema.
		*/
		/*
		* URGENT TODO: If the schema is a chameleon-include then copy
		* the components into the including schema and modify the
		* targetNamespace of those components, do nothing otherwise.
		* NOTE: This is currently worked-around by compiling the
		* chameleon for every distinct including targetNamespace; thus
		* not performant at the moment.
		* TODO: Check when the namespace in wildcards for chameleons
		* needs to be converted: before we built wildcard intersections
		* or after.
		*   Answer: after!
		*/
		chamel = xmlSchemaGetChameleonSchemaBucket(pctxt,
		    schemaLocation, sourceTargetNamespace);
		if (chamel != NULL) {
		    /* A fitting chameleon was already parsed; NOP. */
		    relation->bucket = chamel;
		    goto exit;
		}
		/*
		* We need to parse the chameleon again for a different
		* targetNamespace.
		* CHAMELEON TODO: Optimize this by only parsing the
		* chameleon once, and then copying the components to
		* the new targetNamespace.
		*/
		bkt = NULL;
	    } else {
		relation->bucket = bkt;
		goto exit;
	    }
	}
    }
    if ((bkt != NULL) && (bkt->doc != NULL)) {
	PERROR_INT("xmlSchemaAddSchemaDoc",
	    "trying to load a schema doc, but a doc is already "
	    "assigned to the schema bucket");
	goto exit_failure;
    }

doc_load:
    /*
    * Load the document.
    */
    if (schemaDoc != NULL) {
	doc = schemaDoc;
	/* Don' free this one, since it was provided by the caller. */
	preserveDoc = 1;
	/* TODO: Does the context or the doc hold the location? */
	if (schemaDoc->URL != NULL)
	    schemaLocation = xmlDictLookup(pctxt->dict,
		schemaDoc->URL, -1);
        else
	    schemaLocation = BAD_CAST "in_memory_buffer";
    } else if ((schemaLocation != NULL) || (schemaBuffer != NULL)) {
	xmlParserCtxtPtr parserCtxt;

	parserCtxt = xmlNewParserCtxt();
	if (parserCtxt == NULL) {
	    xmlSchemaPErrMemory(NULL);
	    goto exit_failure;
	}

        if (pctxt->serror != NULL)
            xmlCtxtSetErrorHandler(parserCtxt, pctxt->serror, pctxt->errCtxt);
        if (pctxt->resourceLoader != NULL)
            xmlCtxtSetResourceLoader(parserCtxt, pctxt->resourceLoader,
                                     pctxt->resourceCtxt);

	if ((pctxt->dict != NULL) && (parserCtxt->dict != NULL)) {
	    /*
	    * TODO: Do we have to burden the schema parser dict with all
	    * the content of the schema doc?
	    */
	    xmlDictFree(parserCtxt->dict);
	    parserCtxt->dict = pctxt->dict;
	    xmlDictReference(parserCtxt->dict);
	}
	if (schemaLocation != NULL) {
	    /* Parse from file. */
	    doc = xmlCtxtReadFile(parserCtxt, (const char *) schemaLocation,
		NULL, SCHEMAS_PARSE_OPTIONS);
	} else if (schemaBuffer != NULL) {
	    /* Parse from memory buffer. */
	    doc = xmlCtxtReadMemory(parserCtxt, schemaBuffer, schemaBufferLen,
		NULL, NULL, SCHEMAS_PARSE_OPTIONS);
	    schemaLocation = BAD_CAST "in_memory_buffer";
	    if (doc != NULL)
		doc->URL = xmlStrdup(schemaLocation);
	}
	/*
	* For <import>:
	* 2.1 The referent is (a fragment of) a resource which is an
	* XML document (see clause 1.1), which in turn corresponds to
	* a <schema> element information item in a well-formed information
	* set, which in turn corresponds to a valid schema.
	* TODO: (2.1) fragments of XML documents are not supported.
	*
	* 2.2 The referent is a <schema> element information item in
	* a well-formed information set, which in turn corresponds
	* to a valid schema.
	* TODO: (2.2) is not supported.
	*/
	if (doc == NULL) {
	    const xmlError *lerr;
	    lerr = xmlGetLastError();
	    /*
	    * Check if this a parser error, or if the document could
	    * just not be located.
	    * TODO: Try to find specific error codes to react only on
	    * localisation failures.
	    */
	    if ((lerr == NULL) || (lerr->domain != XML_FROM_IO)) {
		/*
		* We assume a parser error here.
		*/
		located = 1;
		/* TODO: Error code ?? */
		res = XML_SCHEMAP_SRC_IMPORT_2_1;
		xmlSchemaCustomErr(ACTXT_CAST pctxt, res,
		    invokingNode, NULL,
		    "Failed to parse the XML resource '%s'",
		    schemaLocation, NULL);
	    }
	}
	xmlFreeParserCtxt(parserCtxt);
	if ((doc == NULL) && located)
	    goto exit_error;
    } else {
	xmlSchemaPErr(pctxt, NULL,
	    XML_SCHEMAP_NOTHING_TO_PARSE,
	    "No information for parsing was provided with the "
	    "given schema parser context.\n",
	    NULL, NULL);
	goto exit_failure;
    }
    /*
    * Preprocess the document.
    */
    if (doc != NULL) {
	xmlNodePtr docElem = NULL;

	located = 1;
	docElem = xmlDocGetRootElement(doc);
	if (docElem == NULL) {
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, XML_SCHEMAP_NOROOT,
		invokingNode, NULL,
		"The document '%s' has no document element",
		schemaLocation, NULL);
	    goto exit_error;
	}
	/*
	* Remove all the blank text nodes.
	*/
	xmlSchemaCleanupDoc(pctxt, docElem);
	/*
	* Check the schema's top level element.
	*/
	if (!IS_SCHEMA(docElem, "schema")) {
	    xmlSchemaCustomErr(ACTXT_CAST pctxt, XML_SCHEMAP_NOT_SCHEMA,
		invokingNode, NULL,
		"The XML document '%s' is not a schema document",
		schemaLocation, NULL);
	    goto exit_error;
	}
	/*
	* Note that we don't apply a type check for the
	* targetNamespace value here.
	*/
	targetNamespace = xmlSchemaGetProp(pctxt, docElem,
	    "targetNamespace");
    }

/* after_doc_loading: */
    if ((bkt == NULL) && located) {
	/* Only create a bucket if the schema was located. */
        bkt = xmlSchemaBucketCreate(pctxt, type,
	    targetNamespace);
	if (bkt == NULL)
	    goto exit_failure;
    }
    if (bkt != NULL) {
	bkt->schemaLocation = schemaLocation;
	bkt->located = located;
	if (doc != NULL) {
	    bkt->doc = doc;
	    bkt->targetNamespace = targetNamespace;
	    bkt->origTargetNamespace = targetNamespace;
	    if (preserveDoc)
		bkt->preserveDoc = 1;
	}
	if (WXS_IS_BUCKET_IMPMAIN(type))
	    bkt->imported++;
	    /*
	    * Add it to the graph of schemas.
	    */
	if (relation != NULL)
	    relation->bucket = bkt;
    }

exit:
    /*
    * Return the bucket explicitly; this is needed for the
    * main schema.
    */
    if (bucket != NULL)
	*bucket = bkt;
    return (0);

exit_error:
    if ((doc != NULL) && (! preserveDoc)) {
	xmlFreeDoc(doc);
	if (bkt != NULL)
	    bkt->doc = NULL;
    }
    return(pctxt->err);

exit_failure:
    if ((doc != NULL) && (! preserveDoc)) {
	xmlFreeDoc(doc);
	if (bkt != NULL)
	    bkt->doc = NULL;
    }
    return (-1);
}